

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

Primer * __thiscall ASDCP::MXF::Primer::WriteToBuffer(Primer *this,FrameBuffer *Buffer)

{
  bool bVar1;
  ui32_t uVar2;
  int iVar3;
  byte_t *pbVar4;
  FrameBuffer *in_RDX;
  Result_t local_d8 [104];
  ui32_t local_70;
  undefined4 local_6c;
  ui32_t packet_length;
  undefined1 local_58 [8];
  MemIOWriter MemWRT;
  FrameBuffer LocalTagBuffer;
  FrameBuffer *Buffer_local;
  Primer *this_local;
  Result_t *result;
  
  if (Buffer[5]._vptr_FrameBuffer == (_func_int **)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x202,
                  "virtual ASDCP::Result_t ASDCP::MXF::Primer::WriteToBuffer(ASDCP::FrameBuffer &)")
    ;
  }
  FrameBuffer::FrameBuffer((FrameBuffer *)&MemWRT.m_capacity);
  pbVar4 = FrameBuffer::Data(in_RDX);
  uVar2 = FrameBuffer::Capacity(in_RDX);
  Kumu::MemIOWriter::MemIOWriter((MemIOWriter *)local_58,pbVar4 + 0x14,uVar2 - 0x14);
  packet_length._3_1_ = 0;
  bVar1 = FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>::Archive
                    ((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                      *)&Buffer[3].m_Capacity,(MemIOWriter *)local_58);
  if (bVar1) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  else {
    local_6c = 0x205;
    Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar3) {
    local_70 = Kumu::MemIOWriter::Length((MemIOWriter *)local_58);
    (*Buffer->_vptr_FrameBuffer[8])(local_d8,Buffer,in_RDX);
    Kumu::Result_t::operator=((Result_t *)this,local_d8);
    Kumu::Result_t::~Result_t(local_d8);
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar3) {
      uVar2 = FrameBuffer::Size(in_RDX);
      FrameBuffer::Size(in_RDX,uVar2 + local_70);
    }
  }
  packet_length._3_1_ = 1;
  Kumu::MemIOWriter::~MemIOWriter((MemIOWriter *)local_58);
  FrameBuffer::~FrameBuffer((FrameBuffer *)&MemWRT.m_capacity);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::WriteToBuffer(ASDCP::FrameBuffer& Buffer)
{
  assert(m_Dict);
  ASDCP::FrameBuffer LocalTagBuffer;
  Kumu::MemIOWriter MemWRT(Buffer.Data() + kl_length, Buffer.Capacity() - kl_length);
  Result_t result = LocalTagEntryBatch.Archive(&MemWRT) ? RESULT_OK : RESULT_KLV_CODING(__LINE__, __FILE__);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t packet_length = MemWRT.Length();
      result = WriteKLToBuffer(Buffer, packet_length);

      if ( ASDCP_SUCCESS(result) )
	Buffer.Size(Buffer.Size() + packet_length);
    }

  return result;
}